

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

int __thiscall embree::XMLWriter::open(XMLWriter *this,char *__file,int __oflag,...)

{
  ostream *poVar1;
  
  tab((XMLWriter *)__file);
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"<");
  poVar1 = std::operator<<(poVar1,(string *)__file);
  poVar1 = std::operator<<(poVar1,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this->ident = this->ident + 2;
  return (int)this;
}

Assistant:

void XMLWriter::open(std::string str)
  {
    tab(); xml << "<" << str << ">" << std::endl;
    ident+=2;
  }